

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

GLuint __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::buildProgramToTestShaderStage
          (ImageLoadStoreMultipleUniformsTest *this,shaderStage stage)

{
  uint uVar1;
  GLuint GVar2;
  ostream *poVar3;
  undefined **ppuVar4;
  ostream *poVar5;
  InternalError *this_00;
  TestError *this_01;
  _Alloc_hider src_tes;
  _Alloc_hider src_tcs;
  GLint i;
  ulong uVar6;
  pointer_____offset_0x10___ *ppuVar7;
  _Alloc_hider src_gs;
  char *pcVar8;
  undefined **ppuVar9;
  char *pcVar10;
  bool is_program_built;
  shaderStage local_21c;
  imageStoreCall local_218;
  imageStoreCall local_210;
  coordinatesVariableDeclaration local_208;
  string tested_shader_stage_code;
  coordinatesVariableDeclaration local_1d8 [4];
  stringstream stream;
  ostream local_1a8;
  
  is_program_built = true;
  tested_shader_stage_code._M_dataplus._M_p = (pointer)&tested_shader_stage_code.field_2;
  tested_shader_stage_code._M_string_length = 0;
  tested_shader_stage_code.field_2._M_local_buf[0] = '\0';
  local_21c = stage;
  uVar1 = getMaximumImageUniformsForStage(this,stage);
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  if (1 < (int)uVar1) {
    pcVar10 = glcts::fixed_sample_locations_values + 1;
    if ((local_21c != fragmentShaderStage) && (local_21c != vertexShaderStage)) {
      if (local_21c == tesselationControlShaderStage) {
        pcVar10 = "layout(vertices = 4) out;\n\n";
      }
      else if (local_21c == tesselationEvalutaionShaderStage) {
        pcVar10 = "layout(quads, equal_spacing, ccw) in;\n\n";
      }
      else {
        if (local_21c != geometryShaderStage) {
          this_01 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_01,"Invalid shader stage",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                     ,0x245e);
          __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        pcVar10 = "layout(points) in;\nlayout(points, max_vertices = 1) out;\n\n";
      }
    }
    poVar3 = std::operator<<(&local_1a8,
                             "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\n"
                            );
    std::operator<<(poVar3,pcVar10);
    ppuVar9 = &gl4cts::(anonymous_namespace)::ImageLoadStoreMultipleUniformsTest::
               getImageUniformDeclarationDetails(unsigned_int,gl4cts::(anonymous_namespace)::ImageLoadStoreMultipleUniformsTest::imageFormatDetails&)
               ::format_details;
    for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
      ppuVar4 = ppuVar9;
      if (0xd < uVar6) {
        ppuVar4 = &gl4cts::(anonymous_namespace)::ImageLoadStoreMultipleUniformsTest::
                   getImageUniformDeclarationDetails(unsigned_int,gl4cts::(anonymous_namespace)::ImageLoadStoreMultipleUniformsTest::imageFormatDetails&)
                   ::default_format_details;
      }
      pcVar10 = *ppuVar4;
      pcVar8 = ppuVar4[1];
      poVar3 = std::operator<<(&local_1a8,"layout(");
      poVar3 = std::operator<<(poVar3,pcVar10);
      poVar3 = std::operator<<(poVar3,") uniform ");
      poVar3 = std::operator<<(poVar3,pcVar8);
      std::operator<<(poVar3," ");
      writeImageUniformNameToStream(&local_1a8,(GLuint)uVar6);
      std::operator<<(&local_1a8,";");
      std::operator<<(&local_1a8,"\n");
      ppuVar9 = ppuVar9 + 5;
    }
    std::operator<<(&local_1a8,"\nvoid main()\n{\n");
    ppuVar9 = &gl4cts::(anonymous_namespace)::ImageLoadStoreMultipleUniformsTest::
               getImageUniformDeclarationDetails(unsigned_int,gl4cts::(anonymous_namespace)::ImageLoadStoreMultipleUniformsTest::imageFormatDetails&)
               ::format_details;
    for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
      poVar3 = std::operator<<(&local_1a8,"    ");
      GVar2 = (GLuint)uVar6;
      local_1d8[0].m_row = 0;
      local_1d8[0].m_index = GVar2;
      anon_unknown_0::operator<<(poVar3,local_1d8);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"    ");
      local_208.m_row = 1;
      local_208.m_index = GVar2;
      anon_unknown_0::operator<<(poVar3,&local_208);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"    ");
      ppuVar4 = ppuVar9;
      if (0xd < uVar6) {
        ppuVar4 = &gl4cts::(anonymous_namespace)::ImageLoadStoreMultipleUniformsTest::
                   getImageUniformDeclarationDetails(unsigned_int,gl4cts::(anonymous_namespace)::ImageLoadStoreMultipleUniformsTest::imageFormatDetails&)
                   ::default_format_details;
      }
      poVar5 = std::operator<<(poVar3,ppuVar4[2]);
      std::operator<<(poVar5," ");
      writeLoadedValueVariableNameToStream(poVar3,GVar2);
      std::operator<<(poVar3," = imageLoad(");
      writeImageUniformNameToStream(poVar3,GVar2);
      std::operator<<(poVar3,", ");
      writeCoordinatesVariableNameToStream(poVar3,GVar2,0);
      std::operator<<(poVar3,");");
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"    ");
      local_210.m_row = 0;
      local_210.m_index = GVar2;
      anon_unknown_0::operator<<(poVar3,&local_210);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"    ");
      local_218.m_row = 1;
      local_218.m_index = GVar2;
      anon_unknown_0::operator<<(poVar3,&local_218);
      std::operator<<(poVar3,"\n");
      if ((int)(GVar2 + 1) < (int)uVar1) {
        std::operator<<(&local_1a8,"\n");
      }
      ppuVar9 = ppuVar9 + 5;
    }
    std::operator<<(&local_1a8,"}\n\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&tested_shader_stage_code,(string *)local_1d8);
    std::__cxx11::string::~string((string *)local_1d8);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  if (tested_shader_stage_code._M_string_length == 0) {
    GVar2 = 0;
    goto LAB_00a5c1f5;
  }
  if (local_21c == vertexShaderStage) {
    pcVar10 = (char *)tested_shader_stage_code._M_dataplus;
    pcVar8 = 
    "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nvoid main()\n{\n    discard;\n}\n"
    ;
LAB_00a5c199:
    src_gs._M_p = (char *)0x0;
LAB_00a5c19c:
    src_tes._M_p = (char *)0x0;
    src_tcs._M_p = (char *)0x0;
  }
  else {
    if (local_21c == geometryShaderStage) {
      pcVar10 = 
      "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nlayout(location = 0) in vec4 i_position;\n\nvoid main()\n{\n  gl_Position = i_position;\n}\n"
      ;
      pcVar8 = 
      "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nvoid main()\n{\n    discard;\n}\n"
      ;
      src_gs = tested_shader_stage_code._M_dataplus;
      goto LAB_00a5c19c;
    }
    if (local_21c == tesselationControlShaderStage) {
      pcVar10 = 
      "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nlayout(location = 0) in vec4 i_position;\n\nvoid main()\n{\n  gl_Position = i_position;\n}\n"
      ;
      pcVar8 = 
      "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nvoid main()\n{\n    discard;\n}\n"
      ;
      src_gs._M_p = (char *)0x0;
      src_tes._M_p = 
      "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nlayout(quads, equal_spacing, ccw) in;\n\nvoid main()\n{\n\n}\n"
      ;
      src_tcs = tested_shader_stage_code._M_dataplus;
    }
    else {
      if (local_21c != tesselationEvalutaionShaderStage) {
        if (local_21c != fragmentShaderStage) {
          this_00 = (InternalError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    ((TestError *)this_00,"Invalid shader stage",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                     ,0x237e);
          ppuVar7 = &tcu::TestError::typeinfo;
          goto LAB_00a5c248;
        }
        pcVar10 = 
        "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nlayout(location = 0) in vec4 i_position;\n\nvoid main()\n{\n  gl_Position = i_position;\n}\n"
        ;
        pcVar8 = (char *)tested_shader_stage_code._M_dataplus;
        goto LAB_00a5c199;
      }
      pcVar10 = 
      "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nlayout(location = 0) in vec4 i_position;\n\nvoid main()\n{\n  gl_Position = i_position;\n}\n"
      ;
      pcVar8 = 
      "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nvoid main()\n{\n    discard;\n}\n"
      ;
      src_gs._M_p = (char *)0x0;
      src_tes = tested_shader_stage_code._M_dataplus;
      src_tcs._M_p = (char *)0x0;
    }
  }
  GVar2 = ShaderImageLoadStoreBase::BuildProgram
                    (&this->super_ShaderImageLoadStoreBase,pcVar10,src_tcs._M_p,src_tes._M_p,
                     src_gs._M_p,pcVar8,&is_program_built);
  if (is_program_built == false) {
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this_00,"Failed to build program",glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
               ,0x2389);
    ppuVar7 = &tcu::InternalError::typeinfo;
LAB_00a5c248:
    __cxa_throw(this_00,ppuVar7,tcu::Exception::~Exception);
  }
LAB_00a5c1f5:
  std::__cxx11::string::~string((string *)&tested_shader_stage_code);
  return GVar2;
}

Assistant:

GLuint buildProgramToTestShaderStage(shaderStage stage)
	{
		static const char* const boilerplate_fragment_shader_code =
			"#version 400 core\n"
			"#extension GL_ARB_shader_image_load_store : require\n"
			"\n"
			"precision highp float;\n"
			"\n"
			"void main()\n"
			"{\n"
			"    discard;\n"
			"}\n";

		static const char* const boilerplate_tesselation_evaluation_shader_code =
			"#version 400 core\n"
			"#extension GL_ARB_shader_image_load_store : require\n"
			"\n"
			"precision highp float;\n"
			"\n"
			"layout(quads, equal_spacing, ccw) in;\n"
			"\n"
			"void main()\n"
			"{\n"
			"\n"
			"}\n";

		static const char* const boilerplate_vertex_shader_code =
			"#version 400 core\n"
			"#extension GL_ARB_shader_image_load_store : require\n"
			"\n"
			"precision highp float;\n"
			"\n"
			"layout(location = 0) in vec4 i_position;\n"
			"\n"
			"void main()\n"
			"{\n"
			"  gl_Position = i_position;\n"
			"}\n";

		const char* fragment_shader_code			   = boilerplate_fragment_shader_code;
		const char* geometry_shader_code			   = 0;
		bool		is_program_built				   = true;
		GLuint		program_object_id				   = 0;
		const char* tesselation_control_shader_code	= 0;
		const char* tesselation_evaluation_shader_code = 0;
		std::string tested_shader_stage_code;
		const char* vertex_shader_code = boilerplate_vertex_shader_code;

		/* Get source code for tested shader stage */
		prepareShaderForTestedShaderStage(stage, tested_shader_stage_code);

		if (true == tested_shader_stage_code.empty())
		{
			return 0;
		}

		/* Set up source code for all required stages */
		switch (stage)
		{
		case fragmentShaderStage:
			fragment_shader_code = tested_shader_stage_code.c_str();
			break;

		case geometryShaderStage:
			geometry_shader_code = tested_shader_stage_code.c_str();
			break;

		case tesselationControlShaderStage:
			tesselation_control_shader_code	= tested_shader_stage_code.c_str();
			tesselation_evaluation_shader_code = boilerplate_tesselation_evaluation_shader_code;
			break;

		case tesselationEvalutaionShaderStage:
			tesselation_evaluation_shader_code = tested_shader_stage_code.c_str();
			break;

		case vertexShaderStage:
			vertex_shader_code = tested_shader_stage_code.c_str();
			break;

		default:
			TCU_FAIL("Invalid shader stage");
		}

		/* Build program */
		program_object_id =
			BuildProgram(vertex_shader_code, tesselation_control_shader_code, tesselation_evaluation_shader_code,
						 geometry_shader_code, fragment_shader_code, &is_program_built);

		/* Check if program was built */
		if (false == is_program_built)
		{
			throw tcu::InternalError("Failed to build program", "", __FILE__, __LINE__);
		}

		/* Done */
		return program_object_id;
	}